

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_grail_build_blocks(int **arr,int L,int K,int **extbuf,int LExtBuf)

{
  int M;
  void *in_RCX;
  uint in_EDX;
  int L2;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int kbuf;
  int p;
  int restk;
  int rest;
  int p1;
  int p0;
  int h;
  int u;
  int m;
  int in_stack_ffffffffffffffb8;
  uint l1;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_28;
  uint local_24;
  int local_20;
  long local_8;
  
  l1 = in_R8D;
  if ((int)in_EDX < (int)in_R8D) {
    in_R8D = in_EDX;
    l1 = in_EDX;
  }
  for (; (in_R8D & in_R8D - 1) != 0; in_R8D = in_R8D - 1 & in_R8D) {
  }
  if (in_R8D == 0) {
    for (local_20 = 1; local_20 < in_ESI; local_20 = local_20 + 2) {
      local_24 = (uint)(0 < **(int **)(in_RDI + (long)(local_20 + -1) * 8) -
                            **(int **)(in_RDI + (long)local_20 * 8));
      stable_grail_swap1((int **)(in_RDI + (long)(local_20 + -3) * 8),
                         (int **)(in_RDI + (long)(int)(local_20 + -1 + local_24) * 8));
      stable_grail_swap1((int **)(in_RDI + (long)(local_20 + -2) * 8),
                         (int **)(in_RDI + (long)(int)(local_20 - local_24) * 8));
    }
    if (in_ESI % 2 != 0) {
      stable_grail_swap1((int **)(in_RDI + (long)(in_ESI + -1) * 8),
                         (int **)(in_RDI + (long)(in_ESI + -3) * 8));
    }
    local_28 = 2;
  }
  else {
    memcpy(in_RCX,(void *)(in_RDI + (long)(int)in_R8D * -8),(long)(int)in_R8D << 3);
    for (local_20 = 1; local_20 < in_ESI; local_20 = local_20 + 2) {
      local_24 = (uint)(0 < **(int **)(in_RDI + (long)(local_20 + -1) * 8) -
                            **(int **)(in_RDI + (long)local_20 * 8));
      *(undefined8 *)(in_RDI + (long)(local_20 + -3) * 8) =
           *(undefined8 *)(in_RDI + (long)(int)(local_20 + -1 + local_24) * 8);
      *(undefined8 *)(in_RDI + (long)(local_20 + -2) * 8) =
           *(undefined8 *)(in_RDI + (long)(int)(local_20 - local_24) * 8);
    }
    if (in_ESI % 2 != 0) {
      *(undefined8 *)(in_RDI + (long)(in_ESI + -3) * 8) =
           *(undefined8 *)(in_RDI + (long)(in_ESI + -1) * 8);
    }
    local_8 = in_RDI + -0x10;
    for (local_28 = 2; local_28 < (int)in_R8D; local_28 = local_28 << 1) {
      in_stack_ffffffffffffffd0 = in_ESI + local_28 * -2;
      for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 <= in_stack_ffffffffffffffd0;
          in_stack_ffffffffffffffd4 = local_28 * 2 + in_stack_ffffffffffffffd4) {
        stable_grail_merge_left_with_x_buf
                  ((int **)(local_8 + (long)in_stack_ffffffffffffffd4 * 8),local_28,local_28,
                   -local_28);
      }
      in_stack_ffffffffffffffcc = in_ESI - in_stack_ffffffffffffffd4;
      if (local_28 < in_stack_ffffffffffffffcc) {
        stable_grail_merge_left_with_x_buf
                  ((int **)(local_8 + (long)in_stack_ffffffffffffffd4 * 8),local_28,
                   in_stack_ffffffffffffffcc - local_28,-local_28);
      }
      else {
        for (; in_stack_ffffffffffffffd4 < in_ESI;
            in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
          *(undefined8 *)(local_8 + (long)(in_stack_ffffffffffffffd4 - local_28) * 8) =
               *(undefined8 *)(local_8 + (long)in_stack_ffffffffffffffd4 * 8);
        }
      }
      local_8 = local_8 + (long)local_28 * -8;
    }
    memcpy((void *)(local_8 + (long)in_ESI * 8),in_RCX,(long)(int)in_R8D << 3);
  }
  for (; local_28 < (int)in_EDX; local_28 = local_28 << 1) {
    in_stack_ffffffffffffffd0 = in_ESI + local_28 * -2;
    for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 <= in_stack_ffffffffffffffd0;
        in_stack_ffffffffffffffd4 = local_28 * 2 + in_stack_ffffffffffffffd4) {
      stable_grail_merge_left
                ((int **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    }
    in_stack_ffffffffffffffcc = in_ESI - in_stack_ffffffffffffffd4;
    if (local_28 < in_stack_ffffffffffffffcc) {
      stable_grail_merge_left
                ((int **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    }
    else {
      stable_grail_rotate((int **)CONCAT44(in_stack_ffffffffffffffc4,in_R8D),l1,
                          in_stack_ffffffffffffffb8);
    }
  }
  L2 = in_ESI % (int)(in_EDX << 1);
  M = in_ESI - L2;
  if ((int)in_EDX < L2) {
    stable_grail_merge_right
              ((int **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc,L2,M);
  }
  else {
    stable_grail_rotate((int **)CONCAT44(M,in_R8D),l1,in_stack_ffffffffffffffb8);
  }
  while (0 < M) {
    M = M + in_EDX * -2;
    stable_grail_merge_right
              ((int **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc,L2,M);
  }
  return;
}

Assistant:

static void GRAIL_BUILD_BLOCKS(SORT_TYPE *arr, int L, int K, SORT_TYPE *extbuf,
                               int LExtBuf) {
  int m, u, h, p0, p1, rest, restk, p, kbuf;
  kbuf = K < LExtBuf ? K : LExtBuf;

  while (kbuf & (kbuf - 1)) {
    kbuf &= kbuf - 1; /* max power or 2 - just in case */
  }

  if (kbuf) {
    SORT_TYPE_CPY(extbuf, arr - kbuf, kbuf);

    for (m = 1; m < L; m += 2) {
      u = 0;

      if (SORT_CMP_A(arr + (m - 1), arr + m) > 0) {
        u = 1;
      }

      arr[m - 3] = arr[m - 1 + u];
      arr[m - 2] = arr[m - u];
    }

    if (L % 2) {
      arr[L - 3] = arr[L - 1];
    }

    arr -= 2;

    for (h = 2; h < kbuf; h *= 2) {
      p0 = 0;
      p1 = L - 2 * h;

      while (p0 <= p1) {
        GRAIL_MERGE_LEFT_WITH_X_BUF(arr + p0, h, h, -h);
        p0 += 2 * h;
      }

      rest = L - p0;

      if (rest > h) {
        GRAIL_MERGE_LEFT_WITH_X_BUF(arr + p0, h, rest - h, -h);
      } else {
        for (; p0 < L; p0++) {
          arr[p0 - h] = arr[p0];
        }
      }

      arr -= h;
    }

    SORT_TYPE_CPY(arr + L, extbuf, kbuf);
  } else {
    for (m = 1; m < L; m += 2) {
      u = 0;

      if (SORT_CMP_A(arr + (m - 1), arr + m) > 0) {
        u = 1;
      }

      GRAIL_SWAP1(arr + (m - 3), arr + (m - 1 + u));
      GRAIL_SWAP1(arr + (m - 2), arr + (m - u));
    }

    if (L % 2) {
      GRAIL_SWAP1(arr + (L - 1), arr + (L - 3));
    }

    arr -= 2;
    h = 2;
  }

  for (; h < K; h *= 2) {
    p0 = 0;
    p1 = L - 2 * h;

    while (p0 <= p1) {
      GRAIL_MERGE_LEFT(arr + p0, h, h, -h);
      p0 += 2 * h;
    }

    rest = L - p0;

    if (rest > h) {
      GRAIL_MERGE_LEFT(arr + p0, h, rest - h, -h);
    } else {
      GRAIL_ROTATE(arr + p0 - h, h, rest);
    }

    arr -= h;
  }

  restk = L % (2 * K);
  p = L - restk;

  if (restk <= K) {
    GRAIL_ROTATE(arr + p, restk, K);
  } else {
    GRAIL_MERGE_RIGHT(arr + p, K, restk - K, K);
  }

  while (p > 0) {
    p -= 2 * K;
    GRAIL_MERGE_RIGHT(arr + p, K, K, K);
  }
}